

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O3

void uss_open(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,uint flags,fxp_attrs attrs)

{
  UnixSftpServer *uss;
  SftpServerVtable *pSVar1;
  uint *puVar2;
  char *__file;
  SftpServerVtable *pSVar3;
  uint seq;
  uint uVar4;
  unsigned_long uVar5;
  uint uVar6;
  SftpReplyBuilder *reply_00;
  SftpServerVtable *oldlen;
  size_t old_size;
  SftpServerVtable *pSVar7;
  
  uVar6 = 2;
  if ((~flags & 3) != 0) {
    uVar6 = flags >> 1 & 1;
  }
  uVar6 = ((flags & 4) * 0x100 + (flags & 8) * 8 | (flags & 0x10) << 5) + (flags & 0x20) * 4 | uVar6
  ;
  __file = mkstr(path);
  uVar5 = 0x1ff;
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    uVar5 = attrs.permissions;
  }
  reply_00 = (SftpReplyBuilder *)(ulong)uVar6;
  uVar6 = open(__file,uVar6,uVar5);
  free(__file);
  if ((int)uVar6 < 0) {
    uss_error((UnixSftpServer *)reply,reply_00);
    return;
  }
  uss = (UnixSftpServer *)(srv + -6);
  oldlen = (SftpServerVtable *)(ulong)uVar6;
  pSVar7 = srv[-4].vt;
  if (oldlen < pSVar7) {
    pSVar3 = srv[-5].vt;
  }
  else {
    pSVar3 = (SftpServerVtable *)
             safegrowarray(srv[-6].vt,(size_t *)(srv + -4),4,(size_t)oldlen,1,false);
    srv[-6].vt = pSVar3;
    pSVar3 = (SftpServerVtable *)saferealloc(srv[-5].vt,(size_t)srv[-4].vt,1);
    srv[-5].vt = pSVar3;
    pSVar1 = srv[-4].vt;
    if (pSVar7 < pSVar1) {
      puVar2 = uss->fdseqs;
      do {
        puVar2[(long)pSVar7] = 0;
        *(undefined1 *)((long)&pSVar7->new + (long)&pSVar3->new) = 0;
        pSVar7 = (SftpServerVtable *)((long)&pSVar7->new + 1);
      } while (pSVar1 != pSVar7);
    }
  }
  if (*(char *)((long)&oldlen->new + (long)&pSVar3->new) != '\x01') {
    *(undefined1 *)((long)&oldlen->new + (long)&pSVar3->new) = 1;
    uVar4 = uss->fdseqs[(long)oldlen] + 1;
    seq = 0;
    if (uVar4 != 0xffffffff) {
      seq = uVar4;
    }
    uss->fdseqs[(long)oldlen] = seq;
    uss_return_handle_raw(uss,reply,uVar6,seq);
    return;
  }
  __assert_fail("!uss->fdsopen[fd]",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sftpserver.c"
                ,0x82,"void uss_return_new_handle(UnixSftpServer *, SftpReplyBuilder *, int)");
}

Assistant:

static void uss_open(SftpServer *srv, SftpReplyBuilder *reply,
                     ptrlen path, unsigned flags, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    int openflags = 0;
    if (!((SSH_FXF_READ | SSH_FXF_WRITE) &~ flags))
        openflags |= O_RDWR;
    else if (flags & SSH_FXF_WRITE)
        openflags |= O_WRONLY;
    else if (flags & SSH_FXF_READ)
        openflags |= O_RDONLY;
    if (flags & SSH_FXF_APPEND)
        openflags |= O_APPEND;
    if (flags & SSH_FXF_CREAT)
        openflags |= O_CREAT;
    if (flags & SSH_FXF_TRUNC)
        openflags |= O_TRUNC;
    if (flags & SSH_FXF_EXCL)
        openflags |= O_EXCL;

    char *pathstr = mkstr(path);
    int fd = open(pathstr, openflags, GET_PERMISSIONS(attrs, 0777));
    free(pathstr);

    if (fd < 0) {
        uss_error(uss, reply);
    } else {
        uss_return_new_handle(uss, reply, fd);
    }
}